

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int sftp_fstatvfs(LIBSSH2_SFTP_HANDLE *handle,LIBSSH2_SFTP_STATVFS *st)

{
  int iVar1;
  uint32_t uVar2;
  ssize_t sVar3;
  LIBSSH2_CHANNEL *pLVar4;
  libssh2_uint64_t lVar5;
  list_node *plVar6;
  libssh2_uint64_t lVar7;
  long lVar8;
  ulong uVar9;
  uint32_t retcode;
  uint flag;
  ssize_t rc;
  uchar *data;
  uchar *s;
  uchar *packet;
  ulong uStack_40;
  uint32_t packet_len;
  size_t data_len;
  LIBSSH2_SESSION *session;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SFTP *sftp;
  LIBSSH2_SFTP_STATVFS *st_local;
  LIBSSH2_SFTP_HANDLE *handle_local;
  
  channel = (LIBSSH2_CHANNEL *)handle->sftp;
  session = (LIBSSH2_SESSION *)(channel->node).next;
  data_len = (size_t)session->kex_prefs;
  uStack_40 = 0;
  packet._4_4_ = (int)handle->handle_len + 0x25;
  rc = 0;
  sftp = (LIBSSH2_SFTP *)st;
  st_local = (LIBSSH2_SFTP_STATVFS *)handle;
  if (*(libssh2_nonblocking_states *)(channel->reqPTY_packet + 0x58) == libssh2_NB_state_idle) {
    *(uint32_t *)&(channel->local).close = 0;
    data = (uchar *)(*((LIBSSH2_SESSION *)data_len)->alloc)((size_t)packet._4_4_,(void **)data_len);
    s = data;
    if (data == (uchar *)0x0) {
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)data_len,-6,
                             "Unable to allocate memory for FXP_EXTENDED packet");
      return iVar1;
    }
    _libssh2_store_u32(&data,packet._4_4_ - 4);
    *data = 200;
    iVar1 = *(int *)&(channel->node).prev;
    *(int *)&(channel->node).prev = iVar1 + 1;
    *(int *)(channel->reqPTY_packet + 100) = iVar1;
    data = data + 1;
    _libssh2_store_u32(&data,*(uint32_t *)(channel->reqPTY_packet + 100));
    _libssh2_store_str(&data,"fstatvfs@openssh.com",0x14);
    _libssh2_store_str(&data,(char *)&st_local->f_bavail,st_local[3].f_bfree);
    channel->reqPTY_packet[0x58] = '\x02';
    channel->reqPTY_packet[0x59] = '\0';
    channel->reqPTY_packet[0x5a] = '\0';
    channel->reqPTY_packet[0x5b] = '\0';
  }
  else {
    s = *(uchar **)(channel->reqPTY_packet + 0x5c);
  }
  if (*(int *)(channel->reqPTY_packet + 0x58) == 2) {
    sVar3 = _libssh2_channel_write((LIBSSH2_CHANNEL *)session,0,s,(ulong)packet._4_4_);
    if ((sVar3 == -0x25) || ((-1 < sVar3 && (sVar3 < (long)(ulong)packet._4_4_)))) {
      *(uchar **)(channel->reqPTY_packet + 0x5c) = s;
      return -0x25;
    }
    (**(code **)(data_len + 0x18))(s,data_len);
    channel->reqPTY_packet[0x5c] = '\0';
    channel->reqPTY_packet[0x5d] = '\0';
    channel->reqPTY_packet[0x5e] = '\0';
    channel->reqPTY_packet[0x5f] = '\0';
    channel->reqPTY_packet[0x60] = '\0';
    channel->reqPTY_packet[0x61] = '\0';
    channel->reqPTY_packet[0x62] = '\0';
    channel->reqPTY_packet[99] = '\0';
    if (sVar3 < 0) {
      channel->reqPTY_packet[0x58] = '\0';
      channel->reqPTY_packet[0x59] = '\0';
      channel->reqPTY_packet[0x5a] = '\0';
      channel->reqPTY_packet[0x5b] = '\0';
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)data_len,-7,"_libssh2_channel_write() failed");
      return iVar1;
    }
    channel->reqPTY_packet[0x58] = '\x03';
    channel->reqPTY_packet[0x59] = '\0';
    channel->reqPTY_packet[0x5a] = '\0';
    channel->reqPTY_packet[0x5b] = '\0';
  }
  iVar1 = sftp_packet_requirev
                    ((LIBSSH2_SFTP *)channel,2,sftp_fstatvfs::responses,
                     *(uint32_t *)(channel->reqPTY_packet + 100),(uchar **)&rc,
                     &stack0xffffffffffffffc0,9);
  if (iVar1 == -0x25) {
    handle_local._4_4_ = -0x25;
  }
  else if (iVar1 == -0x26) {
    if (uStack_40 != 0) {
      (**(code **)(data_len + 0x18))(rc,data_len);
    }
    handle_local._4_4_ =
         _libssh2_error((LIBSSH2_SESSION *)data_len,-0x1f,"SFTP rename packet too short");
  }
  else if (iVar1 == 0) {
    if (*(char *)rc == 'e') {
      uVar2 = _libssh2_ntohu32((uchar *)(rc + 5));
      channel->reqPTY_packet[0x58] = '\0';
      channel->reqPTY_packet[0x59] = '\0';
      channel->reqPTY_packet[0x5a] = '\0';
      channel->reqPTY_packet[0x5b] = '\0';
      (**(code **)(data_len + 0x18))(rc,data_len);
      (channel->local).close = (char)uVar2;
      (channel->local).eof = (char)(uVar2 >> 8);
      (channel->local).extended_data_ignore_mode = (char)(uVar2 >> 0x10);
      (channel->local).field_0x13 = (char)(uVar2 >> 0x18);
      handle_local._4_4_ = _libssh2_error((LIBSSH2_SESSION *)data_len,-0x1f,"SFTP Protocol Error");
    }
    else if (uStack_40 < 0x5d) {
      (**(code **)(data_len + 0x18))(rc,data_len);
      channel->reqPTY_packet[0x58] = '\0';
      channel->reqPTY_packet[0x59] = '\0';
      channel->reqPTY_packet[0x5a] = '\0';
      channel->reqPTY_packet[0x5b] = '\0';
      handle_local._4_4_ =
           _libssh2_error((LIBSSH2_SESSION *)data_len,-0x1f,"SFTP Protocol Error: short response");
    }
    else {
      channel->reqPTY_packet[0x58] = '\0';
      channel->reqPTY_packet[0x59] = '\0';
      channel->reqPTY_packet[0x5a] = '\0';
      channel->reqPTY_packet[0x5b] = '\0';
      pLVar4 = (LIBSSH2_CHANNEL *)_libssh2_ntohu64((uchar *)(rc + 5));
      sftp->channel = pLVar4;
      lVar5 = _libssh2_ntohu64((uchar *)(rc + 0xd));
      sftp->request_id = (int)lVar5;
      sftp->version = (int)(lVar5 >> 0x20);
      lVar5 = _libssh2_ntohu64((uchar *)(rc + 0x15));
      *(libssh2_uint64_t *)&sftp->posix_rename_extension = lVar5;
      plVar6 = (list_node *)_libssh2_ntohu64((uchar *)(rc + 0x1d));
      (sftp->packets).last = plVar6;
      plVar6 = (list_node *)_libssh2_ntohu64((uchar *)(rc + 0x25));
      (sftp->packets).first = plVar6;
      plVar6 = (list_node *)_libssh2_ntohu64((uchar *)(rc + 0x2d));
      (sftp->zombie_requests).last = plVar6;
      plVar6 = (list_node *)_libssh2_ntohu64((uchar *)(rc + 0x35));
      (sftp->zombie_requests).first = plVar6;
      plVar6 = (list_node *)_libssh2_ntohu64((uchar *)(rc + 0x3d));
      (sftp->sftp_handles).last = plVar6;
      plVar6 = (list_node *)_libssh2_ntohu64((uchar *)(rc + 0x45));
      (sftp->sftp_handles).first = plVar6;
      lVar5 = _libssh2_ntohu64((uchar *)(rc + 0x4d));
      lVar7 = _libssh2_ntohu64((uchar *)(rc + 0x55));
      *(libssh2_uint64_t *)(sftp->packet_header + 4) = lVar7;
      lVar8 = (long)(int)(uint)((lVar5 & 1) != 0);
      sftp->last_errno = (int)lVar8;
      sftp->packet_header[0] = (char)((ulong)lVar8 >> 0x20);
      sftp->packet_header[1] = (char)((ulong)lVar8 >> 0x28);
      sftp->packet_header[2] = (char)((ulong)lVar8 >> 0x30);
      sftp->packet_header[3] = (char)((ulong)lVar8 >> 0x38);
      iVar1 = 0;
      if ((lVar5 & 2) != 0) {
        iVar1 = 2;
      }
      uVar9._0_4_ = sftp->last_errno;
      uVar9._4_1_ = sftp->packet_header[0];
      uVar9._5_1_ = sftp->packet_header[1];
      uVar9._6_1_ = sftp->packet_header[2];
      uVar9._7_1_ = sftp->packet_header[3];
      uVar9 = (long)iVar1 | uVar9;
      sftp->last_errno = (int)uVar9;
      sftp->packet_header[0] = (char)(uVar9 >> 0x20);
      sftp->packet_header[1] = (char)(uVar9 >> 0x28);
      sftp->packet_header[2] = (char)(uVar9 >> 0x30);
      sftp->packet_header[3] = (char)(uVar9 >> 0x38);
      (**(code **)(data_len + 0x18))(rc,data_len);
      handle_local._4_4_ = 0;
    }
  }
  else {
    channel->reqPTY_packet[0x58] = '\0';
    channel->reqPTY_packet[0x59] = '\0';
    channel->reqPTY_packet[0x5a] = '\0';
    channel->reqPTY_packet[0x5b] = '\0';
    handle_local._4_4_ =
         _libssh2_error((LIBSSH2_SESSION *)data_len,iVar1,"Error waiting for FXP EXTENDED REPLY");
  }
  return handle_local._4_4_;
}

Assistant:

static int sftp_fstatvfs(LIBSSH2_SFTP_HANDLE *handle, LIBSSH2_SFTP_STATVFS *st)
{
    LIBSSH2_SFTP *sftp = handle->sftp;
    LIBSSH2_CHANNEL *channel = sftp->channel;
    LIBSSH2_SESSION *session = channel->session;
    size_t data_len = 0;
    /* 17 = packet_len(4) + packet_type(1) + request_id(4) + ext_len(4)
       + handle_len (4) */
    /* 20 = strlen ("fstatvfs@openssh.com") */
    uint32_t packet_len = (uint32_t)(handle->handle_len + 20 + 17);
    unsigned char *packet, *s, *data = NULL;
    ssize_t rc;
    unsigned int flag;
    static const unsigned char responses[2] =
        { SSH_FXP_EXTENDED_REPLY, SSH_FXP_STATUS };

    if(sftp->fstatvfs_state == libssh2_NB_state_idle) {
        sftp->last_errno = LIBSSH2_FX_OK;

        _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                       "Getting file system statistics"));
        s = packet = LIBSSH2_ALLOC(session, packet_len);
        if(!packet) {
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory for FXP_EXTENDED "
                                  "packet");
        }

        _libssh2_store_u32(&s, packet_len - 4);
        *(s++) = SSH_FXP_EXTENDED;
        sftp->fstatvfs_request_id = sftp->request_id++;
        _libssh2_store_u32(&s, sftp->fstatvfs_request_id);
        _libssh2_store_str(&s, "fstatvfs@openssh.com", 20);
        _libssh2_store_str(&s, handle->handle, handle->handle_len);

        sftp->fstatvfs_state = libssh2_NB_state_created;
    }
    else {
        packet = sftp->fstatvfs_packet;
    }

    if(sftp->fstatvfs_state == libssh2_NB_state_created) {
        rc = _libssh2_channel_write(channel, 0, packet, packet_len);
        if(rc == LIBSSH2_ERROR_EAGAIN ||
            (0 <= rc && rc < (ssize_t)packet_len)) {
            sftp->fstatvfs_packet = packet;
            return LIBSSH2_ERROR_EAGAIN;
        }

        LIBSSH2_FREE(session, packet);
        sftp->fstatvfs_packet = NULL;

        if(rc < 0) {
            sftp->fstatvfs_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "_libssh2_channel_write() failed");
        }
        sftp->fstatvfs_state = libssh2_NB_state_sent;
    }

    rc = sftp_packet_requirev(sftp, 2, responses, sftp->fstatvfs_request_id,
                              &data, &data_len, 9);

    if(rc == LIBSSH2_ERROR_EAGAIN) {
        return (int)rc;
    }
    else if(rc == LIBSSH2_ERROR_BUFFER_TOO_SMALL) {
        if(data_len > 0) {
            LIBSSH2_FREE(session, data);
        }
        return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                              "SFTP rename packet too short");
    }
    else if(rc) {
        sftp->fstatvfs_state = libssh2_NB_state_idle;
        return _libssh2_error(session, (int)rc,
                              "Error waiting for FXP EXTENDED REPLY");
    }

    if(data[0] == SSH_FXP_STATUS) {
        uint32_t retcode = _libssh2_ntohu32(data + 5);
        sftp->fstatvfs_state = libssh2_NB_state_idle;
        LIBSSH2_FREE(session, data);
        sftp->last_errno = retcode;
        return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                              "SFTP Protocol Error");
    }

    if(data_len < 93) {
        LIBSSH2_FREE(session, data);
        sftp->fstatvfs_state = libssh2_NB_state_idle;
        return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                              "SFTP Protocol Error: short response");
    }

    sftp->fstatvfs_state = libssh2_NB_state_idle;

    st->f_bsize = _libssh2_ntohu64(data + 5);
    st->f_frsize = _libssh2_ntohu64(data + 13);
    st->f_blocks = _libssh2_ntohu64(data + 21);
    st->f_bfree = _libssh2_ntohu64(data + 29);
    st->f_bavail = _libssh2_ntohu64(data + 37);
    st->f_files = _libssh2_ntohu64(data + 45);
    st->f_ffree = _libssh2_ntohu64(data + 53);
    st->f_favail = _libssh2_ntohu64(data + 61);
    st->f_fsid = _libssh2_ntohu64(data + 69);
    flag = (unsigned int)_libssh2_ntohu64(data + 77);
    st->f_namemax = _libssh2_ntohu64(data + 85);

    st->f_flag = (flag & SSH_FXE_STATVFS_ST_RDONLY)
        ? LIBSSH2_SFTP_ST_RDONLY : 0;
    st->f_flag |= (flag & SSH_FXE_STATVFS_ST_NOSUID)
        ? LIBSSH2_SFTP_ST_NOSUID : 0;

    LIBSSH2_FREE(session, data);
    return 0;
}